

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recompose.hpp
# Opt level: O3

void __thiscall
MGARD::Recomposer<float>::recompose_level_1D
          (Recomposer<float> *this,float *data_pos,size_t n,float h,bool nodal_row)

{
  size_t n_nodal;
  float fVar1;
  uint uVar2;
  ostream *poVar3;
  int iVar4;
  undefined7 in_register_00000009;
  size_t sVar5;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  float *coeff;
  float *nodal_buffer;
  ulong uVar9;
  
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  uVar7 = n >> 1;
  n_nodal = uVar7 + 1;
  uVar9 = n - n_nodal;
  memcpy(this->data_buffer,data_pos,n * 4);
  nodal_buffer = this->data_buffer;
  pfVar6 = this->load_v_buffer;
  if ((int)CONCAT71(in_register_00000009,nodal_row) == 0) {
    compute_load_vector_coeff_row<float>
              (pfVar6,n_nodal,uVar9,h,nodal_buffer,nodal_buffer + uVar7 + 1);
    pfVar6 = this->load_v_buffer;
  }
  else {
    *pfVar6 = nodal_buffer[uVar7 + 1] * 0.5;
    if (1 < uVar9) {
      lVar8 = 0;
      do {
        pfVar6[lVar8 + 1] =
             (nodal_buffer[uVar7 + lVar8 + 1] + nodal_buffer[uVar7 + lVar8 + 2]) * 0.5;
        lVar8 = lVar8 + 1;
      } while ((n - uVar7) + -2 != lVar8);
    }
    pfVar6[uVar9] = nodal_buffer[n - 1] * 0.5;
    if (uVar9 + 1 == uVar7) {
      pfVar6[uVar9 + 1] = 0.0;
    }
  }
  compute_correction<float>(this->correction_buffer,n_nodal,h,pfVar6);
  pfVar6 = this->correction_buffer;
  sVar5 = 0;
  do {
    nodal_buffer[sVar5] = nodal_buffer[sVar5] - pfVar6[sVar5];
    sVar5 = sVar5 + 1;
  } while (n_nodal != sVar5);
  if (n == n_nodal) {
    iVar4 = 0;
  }
  else {
    lVar8 = 1;
    do {
      nodal_buffer[uVar7 + lVar8] =
           (nodal_buffer[lVar8 + -1] + nodal_buffer[lVar8]) * 0.5 + nodal_buffer[uVar7 + lVar8];
      lVar8 = lVar8 + 1;
    } while (n - uVar7 != lVar8);
    iVar4 = (int)uVar9;
    if (0 < iVar4) {
      uVar9 = uVar9 & 0xffffffff;
      do {
        *data_pos = *nodal_buffer;
        pfVar6 = nodal_buffer + uVar7 + 1;
        nodal_buffer = nodal_buffer + 1;
        data_pos[1] = *pfVar6;
        data_pos = data_pos + 2;
        uVar2 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar2;
      } while (uVar2 != 0);
    }
  }
  fVar1 = *nodal_buffer;
  *data_pos = fVar1;
  if (iVar4 + 2 == (int)n_nodal) {
    data_pos[1] = (fVar1 + nodal_buffer[1]) * 0.5;
  }
  return;
}

Assistant:

void recompose_level_1D(T * data_pos, size_t n, T h, bool nodal_row=true){
		cerr << n << endl;
		size_t n_nodal = (n >> 1) + 1;
		size_t n_coeff = n - n_nodal;
		memcpy(data_buffer, data_pos, n*sizeof(T));
		T * nodal_buffer = data_buffer;
		T * coeff_buffer = data_buffer + n_nodal;
		if(nodal_row) compute_load_vector_nodal_row(load_v_buffer, n_nodal, n_coeff, h, coeff_buffer);
        else compute_load_vector_coeff_row(load_v_buffer, n_nodal, n_coeff, h, nodal_buffer, coeff_buffer);
		compute_correction(correction_buffer, n_nodal, h, load_v_buffer);
		subtract_correction(n_nodal, nodal_buffer);
		recover_from_interpolant_difference_1D(n_coeff, nodal_buffer, coeff_buffer);
		data_reverse_reorder_1D(data_pos, n_nodal, n_coeff, nodal_buffer, coeff_buffer);
	}